

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::Logger::initUnflushedCount(Logger *this)

{
  anon_class_16_2_455e6bc1 local_48;
  function<bool_()> local_38;
  EnumType local_12;
  Logger *pLStack_10;
  EnumType lIndex;
  Logger *this_local;
  
  pLStack_10 = this;
  std::
  map<el::Level,_unsigned_int,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_int>_>_>
  ::clear(&this->m_unflushedCount);
  local_12 = 2;
  local_48.this = this;
  local_48.lIndex = &local_12;
  std::function<bool()>::function<el::Logger::initUnflushedCount()::_lambda()_1_,void>
            ((function<bool()> *)&local_38,&local_48);
  LevelHelper::forEachLevel(&local_12,&local_38);
  std::function<bool_()>::~function(&local_38);
  return;
}

Assistant:

void initUnflushedCount(void) {
        m_unflushedCount.clear();
        base::type::EnumType lIndex = LevelHelper::kMinValid;
        LevelHelper::forEachLevel(&lIndex, [&](void) -> bool {
            m_unflushedCount.insert(std::make_pair(LevelHelper::castFromInt(lIndex), 0));
            return false;
        });
    }